

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Point3fi * __thiscall
pbrt::Transform::operator()(Point3fi *__return_storage_ptr__,Transform *this,Point3fi *p)

{
  float fVar1;
  float fVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  Float FVar8;
  float fVar9;
  float fVar10;
  Float FVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Interval<float> IVar34;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auStack_98 [8];
  Tuple3<pbrt::Vector3,_float> local_90;
  Interval<float> local_80;
  undefined1 local_78 [16];
  Interval<float> local_68;
  undefined8 uStack_60;
  Interval<float> local_58;
  undefined8 uStack_50;
  Point3fi local_40;
  Point3f local_24;
  undefined1 extraout_var [56];
  
  bVar16 = &stack0x00000000 != (undefined1 *)0x98;
  bVar15 = (POPCOUNT((ulong)auStack_98 & 0xff) & 1U) == 0;
  fVar36 = (p->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar27 = ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low);
  auVar17 = vaddss_avx512f(auVar27,ZEXT416((uint)fVar36));
  auVar18 = vmulss_avx512f(auVar17,ZEXT416(0x3f000000));
  fVar1 = (p->super_Point3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar17 = vaddss_avx512f(ZEXT416((uint)fVar1),
                           ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high))
  ;
  auVar19 = vmulss_avx512f(auVar17,ZEXT416(0x3f000000));
  fVar2 = (p->super_Point3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
  auVar17 = vaddss_avx512f(ZEXT416((uint)fVar2),
                           ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high))
  ;
  auVar28 = ZEXT416(0x3f000000);
  auVar20 = vmulss_avx512f(auVar17,auVar28);
  FVar3 = (this->m).m[0][0];
  FVar4 = (this->m).m[0][2];
  FVar5 = (this->m).m[0][3];
  auVar12 = vfmadd213ss_fma(auVar20,ZEXT416((uint)FVar4),ZEXT416((uint)FVar5));
  FVar6 = (this->m).m[1][0];
  auVar17 = vbroadcastss_avx512vl(auVar19);
  auVar26 = vinsertps_avx512f(*(undefined1 (*) [16])((this->m).m[0] + 1),
                              ZEXT416((uint)(this->m).m[1][1]),0x10);
  auVar21 = vmulps_avx512vl(auVar17,auVar26);
  auVar17 = vmovshdup_avx(auVar21);
  auVar22 = vfmadd213ss_avx512f(auVar18,ZEXT416((uint)FVar3),auVar21);
  auVar23 = vfmadd231ss_avx512f(auVar17,ZEXT416((uint)FVar6),auVar18);
  FVar7 = (this->m).m[1][2];
  FVar8 = (this->m).m[1][3];
  auVar24 = vfmadd213ss_avx512f(auVar20,ZEXT416((uint)FVar7),ZEXT416((uint)FVar8));
  fVar9 = (this->m).m[2][0];
  auVar37 = ZEXT416((uint)(this->m).m[2][1]);
  auVar25 = vmulss_avx512f(auVar19,auVar37);
  auVar13 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar9),auVar25);
  fVar10 = (this->m).m[2][2];
  FVar11 = (this->m).m[2][3];
  auVar14 = vfmadd213ss_fma(auVar20,ZEXT416((uint)fVar10),ZEXT416((uint)FVar11));
  auVar17 = vmulss_avx512f(auVar19,ZEXT416((uint)(this->m).m[3][1]));
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar18,ZEXT416((uint)(this->m).m[3][0]));
  auVar19 = vfmadd213ss_avx512f(ZEXT416((uint)(this->m).m[3][2]),auVar20,
                                ZEXT416((uint)(this->m).m[3][3]));
  vaddss_avx512f(auVar17,auVar19);
  vsubss_avx512f(ZEXT416((uint)fVar36),auVar27);
  auVar19 = vxorps_avx512vl(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
  auVar17 = vucomiss_avx512f(auVar19);
  fVar36 = auVar18._0_4_;
  if ((!bVar16) && (!bVar15)) {
    vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                   ZEXT416((uint)fVar1));
    auVar19 = vucomiss_avx512f(auVar19);
    if ((!bVar16) && (!bVar15)) {
      vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high),
                     ZEXT416((uint)fVar2));
      auVar19 = vxorps_avx512vl(auVar19,auVar19);
      vucomiss_avx512f(auVar19);
      if ((!bVar16) && (!bVar15)) {
        auVar19._4_4_ = fVar36;
        auVar19._0_4_ = fVar36;
        auVar19._8_4_ = fVar36;
        auVar19._12_4_ = fVar36;
        auVar17 = vinsertps_avx512f(ZEXT416((uint)FVar3),ZEXT416((uint)FVar6),0x10);
        auVar26 = vmulps_avx512vl(auVar19,auVar17);
        auVar19 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar18 = vandps_avx512vl(auVar21,auVar19);
        auVar21 = vbroadcastss_avx512vl(auVar20);
        auVar17 = vinsertps_avx512f(ZEXT416((uint)FVar4),ZEXT416((uint)FVar7),0x10);
        auVar21 = vmulps_avx512vl(auVar21,auVar17);
        auVar17 = vinsertps_avx512f(ZEXT416((uint)FVar5),ZEXT416((uint)FVar8),0x10);
        auVar17 = vandps_avx512vl(auVar17,auVar19);
        auVar26 = vandps_avx512vl(auVar26,auVar19);
        auVar21 = vandps_avx512vl(auVar21,auVar19);
        auVar37._0_4_ = auVar17._0_4_ + auVar26._0_4_ + auVar18._0_4_ + auVar21._0_4_;
        auVar37._4_4_ = auVar17._4_4_ + auVar26._4_4_ + auVar18._4_4_ + auVar21._4_4_;
        auVar37._8_4_ = auVar17._8_4_ + auVar26._8_4_ + auVar18._8_4_ + auVar21._8_4_;
        auVar37._12_4_ = auVar17._12_4_ + auVar26._12_4_ + auVar18._12_4_ + auVar21._12_4_;
        auVar18._8_4_ = 0x34400002;
        auVar18._0_8_ = 0x3440000234400002;
        auVar18._12_4_ = 0x34400002;
        auVar17 = vmulps_avx512vl(auVar37,auVar18);
        local_90._0_8_ = vmovlps_avx(auVar17);
        auVar17 = vandps_avx512vl(ZEXT416((uint)(fVar9 * fVar36)),auVar19);
        auVar26 = vandps_avx512vl(auVar25,auVar19);
        auVar18 = vandps_avx512vl(ZEXT416((uint)(fVar10 * auVar20._0_4_)),auVar19);
        auVar19 = vandps_avx512vl(ZEXT416((uint)FVar11),auVar19);
        local_90.z = (auVar19._0_4_ + auVar26._0_4_ + auVar17._0_4_ + auVar18._0_4_) * 1.7881396e-07
        ;
        goto LAB_00242069;
      }
    }
  }
  auVar19 = vmulss_avx512f(auVar17,auVar28);
  auVar17 = vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                           ZEXT416((uint)fVar1));
  auVar27 = vmulss_avx512f(auVar17,auVar28);
  auVar17 = vsubss_avx512f(ZEXT416((uint)(p->super_Point3<pbrt::Interval<float>_>).
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high),
                           ZEXT416((uint)fVar2));
  auVar28 = vmulss_avx512f(auVar17,auVar28);
  auVar17 = vinsertps_avx512f(ZEXT416((uint)FVar3),ZEXT416((uint)FVar6),0x10);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar30 = vandps_avx512vl(auVar17,auVar29);
  auVar31 = vandps_avx512vl(auVar26,auVar29);
  auVar26 = vinsertps_avx512f(ZEXT416((uint)FVar4),ZEXT416((uint)FVar7),0x10);
  auVar32 = vandps_avx512vl(auVar26,auVar29);
  auVar18 = vbroadcastss_avx512vl(auVar18);
  auVar18 = vmulps_avx512vl(auVar18,auVar17);
  auVar17 = vbroadcastss_avx512vl(auVar20);
  auVar26 = vmulps_avx512vl(auVar17,auVar26);
  auVar17 = vinsertps_avx512f(ZEXT416((uint)FVar5),ZEXT416((uint)FVar8),0x10);
  auVar17 = vandps_avx512vl(auVar17,auVar29);
  auVar33 = vbroadcastss_avx512vl(auVar27);
  auVar31 = vmulps_avx512vl(auVar31,auVar33);
  auVar33 = vbroadcastss_avx512vl(auVar19);
  auVar30 = vfmadd213ps_avx512vl(auVar33,auVar30,auVar31);
  auVar31 = vbroadcastss_avx512vl(auVar28);
  auVar30 = vfmadd213ps_avx512vl(auVar31,auVar32,auVar30);
  auVar18 = vandps_avx512vl(auVar18,auVar29);
  auVar21 = vandps_avx512vl(auVar21,auVar29);
  auVar18 = vaddps_avx512vl(auVar18,auVar21);
  auVar26 = vandps_avx512vl(auVar26,auVar29);
  auVar21._0_4_ = auVar17._0_4_ + auVar18._0_4_ + auVar26._0_4_;
  auVar21._4_4_ = auVar17._4_4_ + auVar18._4_4_ + auVar26._4_4_;
  auVar21._8_4_ = auVar17._8_4_ + auVar18._8_4_ + auVar26._8_4_;
  auVar21._12_4_ = auVar17._12_4_ + auVar18._12_4_ + auVar26._12_4_;
  auVar17._8_4_ = 0x34400002;
  auVar17._0_8_ = 0x3440000234400002;
  auVar17._12_4_ = 0x34400002;
  auVar17 = vmulps_avx512vl(auVar21,auVar17);
  auVar26._8_4_ = 0x3f800002;
  auVar26._0_8_ = 0x3f8000023f800002;
  auVar26._12_4_ = 0x3f800002;
  auVar17 = vfmadd231ps_avx512vl(auVar17,auVar30,auVar26);
  local_90._0_8_ = vmovlps_avx(auVar17);
  auVar17 = vandps_avx512vl(ZEXT416((uint)fVar9),auVar29);
  auVar26 = vandps_avx512vl(auVar37,auVar29);
  auVar26 = vmulss_avx512f(auVar26,auVar27);
  auVar17 = vfmadd231ss_avx512f(auVar26,auVar19,auVar17);
  auVar26 = vandps_avx512vl(ZEXT416((uint)fVar10),auVar29);
  auVar17 = vfmadd213ss_avx512f(auVar26,auVar28,auVar17);
  auVar26 = vandps_avx512vl(ZEXT416((uint)(fVar9 * fVar36)),auVar29);
  auVar18 = vandps_avx512vl(auVar25,auVar29);
  auVar19 = vandps_avx512vl(ZEXT416((uint)(fVar10 * auVar20._0_4_)),auVar29);
  auVar20 = vandps_avx512vl(ZEXT416((uint)FVar11),auVar29);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)((auVar20._0_4_ +
                                           auVar18._0_4_ + auVar26._0_4_ + auVar19._0_4_) *
                                          1.7881396e-07)),auVar17,ZEXT416(0x3f800002));
  local_90.z = auVar17._0_4_;
LAB_00242069:
  local_40.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
  .low = auVar22._0_4_ + auVar12._0_4_;
  local_40.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
  .high = auVar23._0_4_ + auVar24._0_4_;
  local_40.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
  .low = auVar13._0_4_ + auVar14._0_4_;
  local_78 = vucomiss_avx512f(ZEXT416(0x3f800000));
  if ((bVar16) || (bVar15)) {
    local_24.super_Tuple3<pbrt::Point3,_float>.x =
         local_40.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    local_24.super_Tuple3<pbrt::Point3,_float>.y =
         local_40.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    local_24.super_Tuple3<pbrt::Point3,_float>.z =
         local_40.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    Point3fi::Point3fi(&local_40,&local_24,(Vector3f *)&local_90);
    IVar34.high = (float)local_78._0_4_;
    IVar34.low = (float)local_78._0_4_;
    local_78._8_4_ = local_78._0_4_;
    local_78._4_4_ = local_78._0_4_;
    local_78._12_4_ = local_78._0_4_;
    local_58 = Interval<float>::operator/<float>(&local_80,IVar34);
    uStack_50 = extraout_XMM0_Qb;
    local_68 = Interval<float>::operator/<float>(&local_80,(Interval<float>)local_78._0_8_);
    local_80 = local_40.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    uStack_60 = extraout_XMM0_Qb_00;
    auVar35._0_8_ = Interval<float>::operator/<float>(&local_80,(Interval<float>)local_78._0_8_);
    auVar35._8_56_ = extraout_var;
    auVar13._8_8_ = uStack_50;
    auVar13._0_4_ = local_58.low;
    auVar13._4_4_ = local_58.high;
    auVar12._8_8_ = uStack_60;
    auVar12._0_4_ = local_68.low;
    auVar12._4_4_ = local_68.high;
    auVar17 = vunpcklpd_avx(auVar13,auVar12);
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)auVar17._0_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
         (float)(int)((ulong)auVar17._0_8_ >> 0x20);
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)auVar17._8_8_;
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
         (float)(int)((ulong)auVar17._8_8_ >> 0x20);
    IVar34 = (Interval<float>)vmovlps_avx(auVar35._0_16_);
    (__return_storage_ptr__->super_Point3<pbrt::Interval<float>_>).
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar34;
  }
  else {
    Point3fi::Point3fi(__return_storage_ptr__,(Point3f *)0x58,(Vector3f *)0x8);
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    Point3fi operator()(const Point3fi &p) const {
        Float x = Float(p.x), y = Float(p.y), z = Float(p.z);
        // Compute transformed coordinates from point _pt_
        Float xp = (m[0][0] * x + m[0][1] * y) + (m[0][2] * z + m[0][3]);
        Float yp = (m[1][0] * x + m[1][1] * y) + (m[1][2] * z + m[1][3]);
        Float zp = (m[2][0] * x + m[2][1] * y) + (m[2][2] * z + m[2][3]);
        Float wp = (m[3][0] * x + m[3][1] * y) + (m[3][2] * z + m[3][3]);

        // Compute absolute error for transformed point, _pError_
        Vector3f pError;
        if (p.IsExact()) {
            // Compute error for transformed exact _p_
            pError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));

        } else {
            // Compute error for transformed approximate _p_
            Vector3f pInError = p.Error();
            pError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * pInError.x +
                                         std::abs(m[0][1]) * pInError.y +
                                         std::abs(m[0][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * pInError.x +
                                         std::abs(m[1][1]) * pInError.y +
                                         std::abs(m[1][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * pInError.x +
                                         std::abs(m[2][1]) * pInError.y +
                                         std::abs(m[2][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));
        }

        if (wp == 1)
            return Point3fi(Point3f(xp, yp, zp), pError);
        else
            return Point3fi(Point3f(xp, yp, zp), pError) / wp;
    }